

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::unroll_array_from_complex_load
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id,string *expr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRVariable *var;
  SPIRType *pSVar5;
  CompilerError *this_00;
  char (*in_R8) [10];
  allocator local_95;
  uint32_t target_id_local;
  string array_expr;
  string local_70;
  string new_expr;
  
  if ((this->backend).force_gl_in_out_block == true) {
    target_id_local = target_id;
    var = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,source_id);
    if ((var != (SPIRVariable *)0x0) && (var->storage == StorageClassInput)) {
      pSVar5 = Compiler::get_variable_data_type(&this->super_Compiler,var);
      if ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        uVar4 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationBuiltIn
                          );
        bVar1 = Compiler::is_builtin_variable(&this->super_Compiler,var);
        bVar2 = Compiler::is_tessellation_shader(&this->super_Compiler);
        bVar3 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationPatch);
        if ((bVar2 || 1 >= uVar4 && bVar1) && (!bVar3)) {
          join<char_const(&)[2],unsigned_int&,char_const(&)[10]>
                    (&new_expr,(spirv_cross *)0x30ed65,(char (*) [2])&target_id_local,
                     (uint *)"_unrolled",in_R8);
          (*(this->super_Compiler)._vptr_Compiler[0x1a])
                    (&array_expr,this,pSVar5,&new_expr,(ulong)target_id_local);
          statement<std::__cxx11::string,char_const(&)[2]>(this,&array_expr,(char (*) [2])0x304bae);
          ::std::__cxx11::string::~string((string *)&array_expr);
          array_expr._M_dataplus._M_p = (pointer)&array_expr.field_2;
          array_expr._M_string_length = 0;
          array_expr.field_2._M_local_buf[0] = '\0';
          if ((pSVar5->array_size_literal).super_VectorView<bool>.ptr
              [(pSVar5->array_size_literal).super_VectorView<bool>.buffer_size - 1] == true) {
            convert_to_string<unsigned_int,_0>
                      (&local_70,
                       (pSVar5->array).super_VectorView<unsigned_int>.ptr +
                       ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size - 1));
            ::std::__cxx11::string::operator=((string *)&array_expr,(string *)&local_70);
            ::std::__cxx11::string::~string((string *)&local_70);
            if ((pSVar5->array).super_VectorView<unsigned_int>.ptr
                [(pSVar5->array).super_VectorView<unsigned_int>.buffer_size - 1] == 0) {
              this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_70,"Cannot unroll an array copy from unsized array.",
                         &local_95);
              CompilerError::CompilerError(this_00,&local_70);
              __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          else {
            to_expression_abi_cxx11_
                      (&local_70,this,
                       (pSVar5->array).super_VectorView<unsigned_int>.ptr
                       [(pSVar5->array).super_VectorView<unsigned_int>.buffer_size - 1],true);
            ::std::__cxx11::string::operator=((string *)&array_expr,(string *)&local_70);
            ::std::__cxx11::string::~string((string *)&local_70);
          }
          statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
                    (this,(char (*) [25])"for (int i = 0; i < int(",&array_expr,
                     (char (*) [8])"); i++)");
          begin_scope(this);
          if (1 < uVar4 || !bVar1) {
            statement<std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                      (this,&new_expr,(char (*) [7])"[i] = ",expr,(char (*) [5])0x315112);
          }
          else {
            statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[2]>
                      (this,&new_expr,(char (*) [16])"[i] = gl_in[i].",expr,(char (*) [2])0x304bae);
          }
          end_scope(this);
          ::std::__cxx11::string::operator=((string *)expr,(string *)&new_expr);
          ::std::__cxx11::string::~string((string *)&array_expr);
          ::std::__cxx11::string::~string((string *)&new_expr);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::unroll_array_from_complex_load(uint32_t target_id, uint32_t source_id, std::string &expr)
{
	if (!backend.force_gl_in_out_block)
		return;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(source_id);
	if (!var)
		return;

	if (var->storage != StorageClassInput)
		return;

	auto &type = get_variable_data_type(*var);
	if (type.array.empty())
		return;

	auto builtin = BuiltIn(get_decoration(var->self, DecorationBuiltIn));
	bool is_builtin = is_builtin_variable(*var) && (builtin == BuiltInPointSize || builtin == BuiltInPosition);
	bool is_tess = is_tessellation_shader();
	bool is_patch = has_decoration(var->self, DecorationPatch);

	// Tessellation input arrays are special in that they are unsized, so we cannot directly copy from it.
	// We must unroll the array load.
	// For builtins, we couldn't catch this case normally,
	// because this is resolved in the OpAccessChain in most cases.
	// If we load the entire array, we have no choice but to unroll here.
	if (!is_patch && (is_builtin || is_tess))
	{
		auto new_expr = join("_", target_id, "_unrolled");
		statement(variable_decl(type, new_expr, target_id), ";");
		string array_expr;
		if (type.array_size_literal.back())
		{
			array_expr = convert_to_string(type.array.back());
			if (type.array.back() == 0)
				SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
		}
		else
			array_expr = to_expression(type.array.back());

		// The array size might be a specialization constant, so use a for-loop instead.
		statement("for (int i = 0; i < int(", array_expr, "); i++)");
		begin_scope();
		if (is_builtin)
			statement(new_expr, "[i] = gl_in[i].", expr, ";");
		else
			statement(new_expr, "[i] = ", expr, "[i];");
		end_scope();

		expr = move(new_expr);
	}
}